

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FpgaIO.cpp
# Opt level: O1

bool __thiscall FpgaIO::PromWriteByte25AA128(FpgaIO *this,uint16_t addr,uint8_t *data,uchar chan)

{
  byte bVar1;
  int iVar2;
  nodeaddr_t nVar3;
  undefined7 in_register_00000009;
  PromType type;
  undefined6 in_register_00000032;
  BasePort *pBVar4;
  
  iVar2 = (int)CONCAT71(in_register_00000009,chan);
  type = PROM_25AA128_1;
  if (iVar2 != 1) {
    type = (iVar2 == 2) + 2 + (uint)(iVar2 == 2);
  }
  nVar3 = GetPromAddress(this,type,true);
  pBVar4 = (this->super_BoardIO).port;
  (*pBVar4->_vptr_BasePort[0x24])(pBVar4,(ulong)(this->super_BoardIO).BoardId,nVar3,0x6000000);
  Amp1394_Sleep(0.0001);
  bVar1 = *data;
  nVar3 = GetPromAddress((FpgaIO *)pBVar4,type,true);
  pBVar4 = (this->super_BoardIO).port;
  iVar2 = (*pBVar4->_vptr_BasePort[0x24])
                    (pBVar4,(ulong)(this->super_BoardIO).BoardId,nVar3,
                     (ulong)((int)CONCAT62(in_register_00000032,addr) * 0x100 + (uint)bVar1 +
                            0x2000000));
  if (SUB41(iVar2,0) != false) {
    Amp1394_Sleep(0.005);
  }
  return SUB41(iVar2,0);
}

Assistant:

bool FpgaIO::PromWriteByte25AA128(uint16_t addr, const uint8_t &data, unsigned char chan)
{
    PromType prom_type = (chan == 1) ? PROM_25AA128_1 : (chan == 2) ? PROM_25AA128_2 : PROM_25AA128;

    // enable write
    PromWriteEnable(prom_type);
    Amp1394_Sleep(0.0001);   // 100 usec

    // 8-bit cmd + 16-bit addr + 8-bit data
    quadlet_t write_data = 0x02000000|(addr << 8)|data;
    nodeaddr_t address = GetPromAddress(prom_type, true);
    if (port->WriteQuadlet(BoardId, address, write_data)) {
        // wait 5ms for the PROM to be ready to take new commands
        Amp1394_Sleep(0.005);
        return true;
    }
    else
        return false;
}